

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int discard_handshake_context(quicly_conn_t *conn,size_t epoch)

{
  int iVar1;
  quicly_stream_t *stream;
  
  if ((epoch & 0xfffffffffffffffd) == 0) {
    iVar1 = discard_sentmap_by_epoch(conn,1 << ((byte)epoch & 0x1f));
    if (iVar1 == 0) {
      stream = quicly_get_stream(conn,~epoch);
      if (stream != (quicly_stream_t *)0x0) {
        destroy_stream(stream,0);
      }
      free_handshake_space(&conn->initial + (epoch != 0));
    }
    return iVar1;
  }
  __assert_fail("epoch == QUICLY_EPOCH_INITIAL || epoch == QUICLY_EPOCH_HANDSHAKE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                ,0x59c,"int discard_handshake_context(quicly_conn_t *, size_t)");
}

Assistant:

static int discard_handshake_context(quicly_conn_t *conn, size_t epoch)
{
    int ret;

    assert(epoch == QUICLY_EPOCH_INITIAL || epoch == QUICLY_EPOCH_HANDSHAKE);

    if ((ret = discard_sentmap_by_epoch(conn, 1u << epoch)) != 0)
        return ret;
    destroy_handshake_flow(conn, epoch);
    free_handshake_space(epoch == QUICLY_EPOCH_INITIAL ? &conn->initial : &conn->handshake);

    return 0;
}